

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char * string_feeder_peek_length(string_feeder_t *sf,size_t length)

{
  char *__dest;
  char *substr;
  size_t length_local;
  string_feeder_t *sf_local;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x20d,"char *string_feeder_peek_length(string_feeder_t *, size_t)");
  }
  if (sf->len < sf->pos) {
    __assert_fail("sf->pos <= sf->len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x20f,"char *string_feeder_peek_length(string_feeder_t *, size_t)");
  }
  substr = (char *)length;
  if (sf->len < sf->pos + length) {
    substr = (char *)(sf->len - sf->pos);
  }
  __dest = (char *)calloc((size_t)(substr + 1),1);
  memcpy(__dest,sf->s + sf->pos,(size_t)substr);
  return __dest;
}

Assistant:

char *string_feeder_peek_length(string_feeder_t *sf, size_t length)
{
    assert(sf != NULL);
    assert(length >= 0);
    assert(sf->pos <= sf->len);

    if (sf->pos + length > sf->len)
        length = sf->len - sf->pos;

    char *substr = calloc(length+1, sizeof(char));
    memcpy(substr, &sf->s[sf->pos], length*sizeof(char));
    return substr;
}